

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::performSolutionPolishing
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  byte bVar1;
  uint n;
  uint n_00;
  SPxOut *pSVar2;
  pointer pnVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  Status SVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *pCVar13;
  long lVar14;
  long *plVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  long *plVar17;
  undefined4 *puVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  uint *puVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  soplex *psVar23;
  int i;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *pCVar24;
  byte bVar25;
  Real RVar26;
  SPxId polishId;
  DIdxSet slackcandidates;
  Verbosity old_verbosity;
  DIdxSet continuousvars;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  origval;
  char local_c21;
  DataKey local_c20;
  DIdxSet local_c18;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_bf8;
  Status *local_bf0;
  Status *local_be8;
  int local_bdc;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_bd8;
  undefined8 uStack_bd0;
  cpp_dec_float<200U,_int,_void> local_bc8;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_b48;
  undefined8 uStack_b40;
  DIdxSet local_b30;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_b10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b08;
  fpclass_type local_a88;
  int32_t iStack_a84;
  undefined8 uStack_a80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a78;
  soplex local_9f8 [112];
  int local_988;
  byte local_984;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_980;
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [13];
  undefined3 uStack_90b;
  int iStack_908;
  bool bStack_904;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_900;
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [13];
  undefined3 uStack_88b;
  int iStack_888;
  bool bStack_884;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_880;
  cpp_dec_float<200U,_int,_void> local_878;
  cpp_dec_float<200U,_int,_void> local_7f8;
  cpp_dec_float<200U,_int,_void> local_778;
  cpp_dec_float<200U,_int,_void> local_6f8;
  cpp_dec_float<200U,_int,_void> local_678;
  uint local_5f8 [30];
  cpp_dec_float<200U,_int,_void> local_580;
  cpp_dec_float<200U,_int,_void> local_500;
  cpp_dec_float<200U,_int,_void> local_480;
  cpp_dec_float<200U,_int,_void> local_400;
  cpp_dec_float<200U,_int,_void> local_380;
  cpp_dec_float<200U,_int,_void> local_300;
  undefined4 local_280 [28];
  undefined4 local_210 [28];
  undefined4 local_1a0 [28];
  uint local_130 [28];
  int local_c0;
  undefined1 local_bc;
  fpclass_type local_b8;
  int32_t iStack_b4;
  undefined4 local_b0 [28];
  undefined4 local_40;
  undefined1 local_3c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  
  bVar25 = 0;
  bVar5 = false;
  if ((-1 < this->maxIters) &&
     (this->maxIters <=
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).iterCount)) {
    bVar5 = isTimeLimitReached(this,false);
    bVar5 = !bVar5;
  }
  if (((bVar5) || (this->polishObj == POLISH_OFF)) || (SVar7 = status(this), SVar7 != OPTIMAL)) {
    bVar5 = false;
  }
  else {
    local_bf0 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
    local_be8 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data;
    local_c20.info = 0;
    local_c20.idx = -1;
    local_5f8[0x18] = 0;
    local_5f8[0x19] = 0;
    local_5f8[0x1a] = 0;
    local_5f8[0x1b] = 0;
    local_5f8[0x14] = 0;
    local_5f8[0x15] = 0;
    local_5f8[0x16] = 0;
    local_5f8[0x17] = 0;
    local_5f8[0x10] = 0;
    local_5f8[0x11] = 0;
    local_5f8[0x12] = 0;
    local_5f8[0x13] = 0;
    local_5f8[0xc] = 0;
    local_5f8[0xd] = 0;
    local_5f8[0xe] = 0;
    local_5f8[0xf] = 0;
    local_5f8[8] = 0;
    local_5f8[9] = 0;
    local_5f8[10] = 0;
    local_5f8[0xb] = 0;
    local_5f8[4] = 0;
    local_5f8[5] = 0;
    local_5f8[6] = 0;
    local_5f8[7] = 0;
    local_5f8[0] = 0;
    local_5f8[1] = 0;
    local_5f8[2] = 0;
    local_5f8[3] = 0;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(local_130,this);
    pSVar2 = this->spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (3 < (int)pSVar2->m_verbosity)) {
      local_b08.m_backend.data._M_elems[0] = 4;
      local_bc8.data._M_elems[0] = pSVar2->m_verbosity;
      (*pSVar2->_vptr_SPxOut[2])();
      pSVar2 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar2->m_streams[pSVar2->m_verbosity]," --- perform solution polishing",0x1f);
      cVar4 = (char)pSVar2->m_streams[pSVar2->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar2->m_streams[pSVar2->m_verbosity] + -0x18)
                      + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_bc8);
    }
    if (this->theRep == COLUMN) {
      setType(this,ENTER);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])(this);
      entertol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_bc8,this);
      pcVar19 = &local_bc8;
      puVar21 = local_5f8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar21 = (((cpp_dec_float<200U,_int,_void> *)&pcVar19->data)->data)._M_elems[0];
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + ((ulong)bVar25 * -2 + 1) * 4);
        puVar21 = puVar21 + (ulong)bVar25 * -2 + 1;
      }
      local_bdc = local_bc8.exp;
      local_c21 = local_bc8.neg;
      local_a88 = local_bc8.fpclass;
      iStack_a84 = local_bc8.prec_elem;
      uStack_a80 = 0;
      this->instableEnter = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      if (this->polishObj == POLISH_INTEGRALITY) {
        n = (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
        pCVar13 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                   *)(ulong)n;
        n_00 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
        DIdxSet::DIdxSet(&local_c18,n);
        local_bd8 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     *)(ulong)n_00;
        DIdxSet::DIdxSet(&local_b30,n_00);
        if (0 < (int)n) {
          lVar10 = 0x78;
          pCVar24 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     *)0x0;
          local_bf8 = pCVar13;
          do {
            if ((local_bf0[(long)pCVar24] | D_ON_UPPER) == P_ON_UPPER) {
              plVar17 = (long *)((long)(((this->theCoPvec->
                                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data
                                       ._M_elems + lVar10);
              plVar15 = plVar17 + -0xf;
              puVar18 = local_1a0;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                *puVar18 = (int)*plVar15;
                plVar15 = (long *)((long)plVar15 + (ulong)bVar25 * -8 + 4);
                puVar18 = puVar18 + (ulong)bVar25 * -2 + 1;
              }
              lVar11 = plVar17[-1];
              bVar1 = *(byte *)((long)plVar17 + -4);
              local_b48 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                           *)*plVar17;
              uStack_b40 = 0;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_380,0,(type *)0x0);
              RVar26 = Tolerances::epsilon((this->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              local_678.fpclass = cpp_dec_float_finite;
              local_678.prec_elem = 0x1c;
              local_678.data._M_elems[0] = 0;
              local_678.data._M_elems[1] = 0;
              local_678.data._M_elems[2] = 0;
              local_678.data._M_elems[3] = 0;
              local_678.data._M_elems[4] = 0;
              local_678.data._M_elems[5] = 0;
              local_678.data._M_elems[6] = 0;
              local_678.data._M_elems[7] = 0;
              local_678.data._M_elems[8] = 0;
              local_678.data._M_elems[9] = 0;
              local_678.data._M_elems[10] = 0;
              local_678.data._M_elems[0xb] = 0;
              local_678.data._M_elems[0xc] = 0;
              local_678.data._M_elems[0xd] = 0;
              local_678.data._M_elems[0xe] = 0;
              local_678.data._M_elems[0xf] = 0;
              local_678.data._M_elems[0x10] = 0;
              local_678.data._M_elems[0x11] = 0;
              local_678.data._M_elems[0x12] = 0;
              local_678.data._M_elems[0x13] = 0;
              local_678.data._M_elems[0x14] = 0;
              local_678.data._M_elems[0x15] = 0;
              local_678.data._M_elems[0x16] = 0;
              local_678.data._M_elems[0x17] = 0;
              local_678.data._M_elems[0x18] = 0;
              local_678.data._M_elems[0x19] = 0;
              local_678.data._M_elems._104_5_ = 0;
              local_678.data._M_elems[0x1b]._1_3_ = 0;
              local_678.exp = 0;
              local_678.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_678,RVar26);
              puVar18 = local_1a0;
              psVar23 = local_9f8;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                *(undefined4 *)psVar23 = *puVar18;
                puVar18 = puVar18 + (ulong)bVar25 * -2 + 1;
                psVar23 = psVar23 + (ulong)bVar25 * -8 + 4;
              }
              local_988 = (int)lVar11;
              local_984 = bVar1;
              local_980 = local_b48;
              pcVar19 = &local_380;
              pnVar20 = &local_a78;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar19 + ((ulong)bVar25 * -2 + 1) * 4);
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar25 * -2 + 1) * 4);
              }
              local_a78.m_backend.exp = local_380.exp;
              local_a78.m_backend.neg = local_380.neg;
              local_a78.m_backend.fpclass = local_380.fpclass;
              local_a78.m_backend.prec_elem = local_380.prec_elem;
              relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                        (&local_b08,local_9f8,&local_a78,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x0);
              local_bc8.fpclass = cpp_dec_float_finite;
              local_bc8.prec_elem = 0x1c;
              local_bc8.neg = false;
              local_bc8.exp = 0;
              pnVar20 = &local_b08;
              pcVar19 = &local_bc8;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pcVar19->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar25 * -2 + 1) * 4);
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar19 + ((ulong)bVar25 * -2 + 1) * 4);
              }
              local_bc8.exp = local_b08.m_backend.exp;
              local_bc8.neg = local_b08.m_backend.neg;
              local_bc8.fpclass = local_b08.m_backend.fpclass;
              local_bc8.prec_elem = local_b08.m_backend.prec_elem;
              if ((local_b08.m_backend.neg == true) &&
                 (local_bc8.data._M_elems[0] != ERROR ||
                  local_b08.m_backend.fpclass != cpp_dec_float_finite)) {
                local_bc8.neg = false;
              }
              pCVar13 = local_bf8;
              if (((local_b08.m_backend.fpclass != cpp_dec_float_NaN) &&
                  (local_678.fpclass != cpp_dec_float_NaN)) &&
                 (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    (&local_bc8,&local_678), pCVar13 = local_bf8, iVar8 < 1)) {
                DIdxSet::addIdx(&local_c18,(int)pCVar24);
              }
            }
            pCVar24 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       *)((long)&pCVar24->theitem + 1);
            lVar10 = lVar10 + 0x80;
          } while (pCVar13 != pCVar24);
        }
        if (0 < (int)local_bd8 && (this->integerVariables).thesize == (int)local_bd8) {
          lVar10 = 0x78;
          pCVar13 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     *)0x0;
          do {
            if ((local_be8[(long)pCVar13] | D_ON_UPPER) == P_ON_UPPER) {
              pnVar3 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)(pnVar3->m_backend).data._M_elems + lVar10 + -0x78);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)(((this->thePvec->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                               _M_elems + lVar10 + -0x78);
              local_880 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                           *)0x1c00000000;
              local_8f8 = (undefined1  [16])0x0;
              local_8e8 = (undefined1  [16])0x0;
              local_8d8 = (undefined1  [16])0x0;
              local_8c8 = (undefined1  [16])0x0;
              local_8b8 = (undefined1  [16])0x0;
              local_8a8 = (undefined1  [16])0x0;
              local_898 = SUB1613((undefined1  [16])0x0,0);
              uStack_88b = 0;
              iStack_888 = 0;
              bStack_884 = false;
              if (pcVar19 == (cpp_dec_float<200U,_int,_void> *)local_8f8) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_8f8,pcVar16);
                if (local_8f8._0_4_ != 0 || (fpclass_type)local_880 != cpp_dec_float_finite) {
                  bStack_884 = (bool)(bStack_884 ^ 1);
                }
              }
              else {
                if (pcVar16 != (cpp_dec_float<200U,_int,_void> *)local_8f8) {
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_8f8;
                  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                    (pcVar22->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
                    pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar16 + (ulong)bVar25 * -8 + 4);
                    pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar22 + (ulong)bVar25 * -8 + 4);
                  }
                  iStack_888 = *(int *)((long)(pnVar3->m_backend).data._M_elems + lVar10 + -8);
                  bStack_884 = *(bool *)((long)(pnVar3->m_backend).data._M_elems + lVar10 + -4);
                  local_880 = *(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                                **)((long)(pnVar3->m_backend).data._M_elems + lVar10);
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_8f8,pcVar19);
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_400,0,(type *)0x0);
              RVar26 = Tolerances::epsilon((this->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              local_6f8.fpclass = cpp_dec_float_finite;
              local_6f8.prec_elem = 0x1c;
              local_6f8.data._M_elems[0] = 0;
              local_6f8.data._M_elems[1] = 0;
              local_6f8.data._M_elems[2] = 0;
              local_6f8.data._M_elems[3] = 0;
              local_6f8.data._M_elems[4] = 0;
              local_6f8.data._M_elems[5] = 0;
              local_6f8.data._M_elems[6] = 0;
              local_6f8.data._M_elems[7] = 0;
              local_6f8.data._M_elems[8] = 0;
              local_6f8.data._M_elems[9] = 0;
              local_6f8.data._M_elems[10] = 0;
              local_6f8.data._M_elems[0xb] = 0;
              local_6f8.data._M_elems[0xc] = 0;
              local_6f8.data._M_elems[0xd] = 0;
              local_6f8.data._M_elems[0xe] = 0;
              local_6f8.data._M_elems[0xf] = 0;
              local_6f8.data._M_elems[0x10] = 0;
              local_6f8.data._M_elems[0x11] = 0;
              local_6f8.data._M_elems[0x12] = 0;
              local_6f8.data._M_elems[0x13] = 0;
              local_6f8.data._M_elems[0x14] = 0;
              local_6f8.data._M_elems[0x15] = 0;
              local_6f8.data._M_elems[0x16] = 0;
              local_6f8.data._M_elems[0x17] = 0;
              local_6f8.data._M_elems[0x18] = 0;
              local_6f8.data._M_elems[0x19] = 0;
              local_6f8.data._M_elems._104_5_ = 0;
              local_6f8.data._M_elems[0x1b]._1_3_ = 0;
              local_6f8.exp = 0;
              local_6f8.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_6f8,RVar26);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_8f8;
              psVar23 = local_9f8;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                *(uint *)psVar23 = (pcVar19->data)._M_elems[0];
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar25 * -8 + 4)
                ;
                psVar23 = psVar23 + (ulong)bVar25 * -8 + 4;
              }
              local_988 = iStack_888;
              local_984 = bStack_884;
              local_980 = local_880;
              pcVar19 = &local_400;
              pnVar20 = &local_a78;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar19 + ((ulong)bVar25 * -2 + 1) * 4);
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar25 * -2 + 1) * 4);
              }
              local_a78.m_backend.exp = local_400.exp;
              local_a78.m_backend.neg = local_400.neg;
              local_a78.m_backend.fpclass = local_400.fpclass;
              local_a78.m_backend.prec_elem = local_400.prec_elem;
              relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                        (&local_b08,local_9f8,&local_a78,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x0);
              local_bc8.fpclass = cpp_dec_float_finite;
              local_bc8.prec_elem = 0x1c;
              local_bc8.neg = false;
              local_bc8.exp = 0;
              pnVar20 = &local_b08;
              pcVar19 = &local_bc8;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pcVar19->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar25 * -2 + 1) * 4);
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar19 + ((ulong)bVar25 * -2 + 1) * 4);
              }
              local_bc8.exp = local_b08.m_backend.exp;
              local_bc8.neg = local_b08.m_backend.neg;
              local_bc8.fpclass = local_b08.m_backend.fpclass;
              local_bc8.prec_elem = local_b08.m_backend.prec_elem;
              if ((local_b08.m_backend.neg == true) &&
                 (local_bc8.data._M_elems[0] != ERROR ||
                  local_b08.m_backend.fpclass != cpp_dec_float_finite)) {
                local_bc8.neg = false;
              }
              if (((local_b08.m_backend.fpclass != cpp_dec_float_NaN) &&
                  (local_6f8.fpclass != cpp_dec_float_NaN)) &&
                 ((iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     (&local_bc8,&local_6f8), iVar8 < 1 &&
                  ((this->integerVariables).data[(long)pCVar13] == 0)))) {
                DIdxSet::addIdx(&local_b30,(int)pCVar13);
              }
            }
            pCVar13 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       *)((long)&pCVar13->theitem + 1);
            lVar10 = lVar10 + 0x80;
          } while (local_bd8 != pCVar13);
        }
        do {
          lVar10 = (long)local_c18.super_IdxSet.num;
          if ((lVar10 < 1) || (bVar5)) {
            iVar8 = 0;
          }
          else {
            iVar8 = 0;
            do {
              local_c20 = (DataKey)coId(this,local_c18.super_IdxSet.idx[lVar10 + -1]);
              bVar6 = enter(this,(SPxId *)&local_c20,true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar6) {
                iVar8 = iVar8 + 1;
                lVar11 = (long)local_c18.super_IdxSet.num;
                local_c18.super_IdxSet.num = local_c18.super_IdxSet.num + -1;
                local_c18.super_IdxSet.idx[lVar10 + -1] = local_c18.super_IdxSet.idx[lVar11 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar5 = true;
                }
              }
              bVar6 = isTimeLimitReached(this,false);
              if (bVar6) {
                bVar5 = true;
              }
            } while ((1 < lVar10) && (lVar10 = lVar10 + -1, !bVar5));
          }
          lVar10 = (long)local_b30.super_IdxSet.num;
          if (0 < lVar10) {
            while (!bVar5) {
              local_c20 = (DataKey)id(this,local_b30.super_IdxSet.idx[lVar10 + -1]);
              bVar6 = enter(this,(SPxId *)&local_c20,true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar6) {
                iVar8 = iVar8 + 1;
                lVar11 = (long)local_b30.super_IdxSet.num;
                local_b30.super_IdxSet.num = local_b30.super_IdxSet.num + -1;
                local_b30.super_IdxSet.idx[lVar10 + -1] = local_b30.super_IdxSet.idx[lVar11 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar5 = true;
                }
              }
              bVar6 = isTimeLimitReached(this,false);
              if (bVar6) {
                bVar5 = true;
              }
              if (lVar10 < 2) break;
              lVar10 = lVar10 + -1;
            }
          }
          if (iVar8 == 0) {
            bVar5 = true;
          }
          this->polishCount = this->polishCount + iVar8;
        } while (!bVar5);
        DIdxSet::~DIdxSet(&local_b30);
      }
      else {
        DIdxSet::DIdxSet(&local_c18,(this->thecovectors->set).thenum);
        if (0 < (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum) {
          lVar10 = 0;
          lVar11 = 0;
          do {
            if ((local_be8[lVar11] | D_ON_UPPER) == P_ON_UPPER) {
              pnVar3 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)(pnVar3->m_backend).data._M_elems + lVar10);
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)(((this->thePvec->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                               _M_elems + lVar10);
              local_900 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                           *)0x1c00000000;
              local_978 = (undefined1  [16])0x0;
              local_968 = (undefined1  [16])0x0;
              local_958 = (undefined1  [16])0x0;
              local_948 = (undefined1  [16])0x0;
              local_938 = (undefined1  [16])0x0;
              local_928 = (undefined1  [16])0x0;
              local_918 = SUB1613((undefined1  [16])0x0,0);
              uStack_90b = 0;
              iStack_908 = 0;
              bStack_904 = false;
              if (pcVar16 == (cpp_dec_float<200U,_int,_void> *)local_978) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_978,pcVar19);
                if (local_978._0_4_ != 0 || (fpclass_type)local_900 != cpp_dec_float_finite) {
                  bStack_904 = (bool)(bStack_904 ^ 1);
                }
              }
              else {
                if (pcVar19 != (cpp_dec_float<200U,_int,_void> *)local_978) {
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_978;
                  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                    (pcVar22->data)._M_elems[0] = (pcVar19->data)._M_elems[0];
                    pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar19 + (ulong)bVar25 * -8 + 4);
                    pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar22 + (ulong)bVar25 * -8 + 4);
                  }
                  iStack_908 = *(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar10);
                  bStack_904 = *(bool *)((long)(&(pnVar3->m_backend).data + 1) + lVar10 + 4U);
                  local_900 = *(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                                **)((long)(&(pnVar3->m_backend).data + 1) + lVar10 + 8U);
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_978,pcVar16);
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_480,0,(type *)0x0);
              RVar26 = Tolerances::epsilon((this->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              local_778.fpclass = cpp_dec_float_finite;
              local_778.prec_elem = 0x1c;
              local_778.data._M_elems[0] = 0;
              local_778.data._M_elems[1] = 0;
              local_778.data._M_elems[2] = 0;
              local_778.data._M_elems[3] = 0;
              local_778.data._M_elems[4] = 0;
              local_778.data._M_elems[5] = 0;
              local_778.data._M_elems[6] = 0;
              local_778.data._M_elems[7] = 0;
              local_778.data._M_elems[8] = 0;
              local_778.data._M_elems[9] = 0;
              local_778.data._M_elems[10] = 0;
              local_778.data._M_elems[0xb] = 0;
              local_778.data._M_elems[0xc] = 0;
              local_778.data._M_elems[0xd] = 0;
              local_778.data._M_elems[0xe] = 0;
              local_778.data._M_elems[0xf] = 0;
              local_778.data._M_elems[0x10] = 0;
              local_778.data._M_elems[0x11] = 0;
              local_778.data._M_elems[0x12] = 0;
              local_778.data._M_elems[0x13] = 0;
              local_778.data._M_elems[0x14] = 0;
              local_778.data._M_elems[0x15] = 0;
              local_778.data._M_elems[0x16] = 0;
              local_778.data._M_elems[0x17] = 0;
              local_778.data._M_elems[0x18] = 0;
              local_778.data._M_elems[0x19] = 0;
              local_778.data._M_elems._104_5_ = 0;
              local_778.data._M_elems[0x1b]._1_3_ = 0;
              local_778.exp = 0;
              local_778.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_778,RVar26);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_978;
              psVar23 = local_9f8;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                *(uint *)psVar23 = (pcVar19->data)._M_elems[0];
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar25 * -8 + 4)
                ;
                psVar23 = psVar23 + (ulong)bVar25 * -8 + 4;
              }
              local_988 = iStack_908;
              local_984 = bStack_904;
              local_980 = local_900;
              pcVar19 = &local_480;
              pnVar20 = &local_a78;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar19 + ((ulong)bVar25 * -2 + 1) * 4);
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar25 * -2 + 1) * 4);
              }
              local_a78.m_backend.exp = local_480.exp;
              local_a78.m_backend.neg = local_480.neg;
              local_a78.m_backend.fpclass = local_480.fpclass;
              local_a78.m_backend.prec_elem = local_480.prec_elem;
              relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                        (&local_b08,local_9f8,&local_a78,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x0);
              local_bc8.fpclass = cpp_dec_float_finite;
              local_bc8.prec_elem = 0x1c;
              local_bc8.neg = false;
              local_bc8.exp = 0;
              pnVar20 = &local_b08;
              pcVar19 = &local_bc8;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pcVar19->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar25 * -2 + 1) * 4);
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar19 + ((ulong)bVar25 * -2 + 1) * 4);
              }
              local_bc8.exp = local_b08.m_backend.exp;
              local_bc8.neg = local_b08.m_backend.neg;
              local_bc8.fpclass = local_b08.m_backend.fpclass;
              local_bc8.prec_elem = local_b08.m_backend.prec_elem;
              if ((local_b08.m_backend.neg == true) &&
                 (local_bc8.data._M_elems[0] != ERROR ||
                  local_b08.m_backend.fpclass != cpp_dec_float_finite)) {
                local_bc8.neg = false;
              }
              if (((local_b08.m_backend.fpclass != cpp_dec_float_NaN) &&
                  (local_778.fpclass != cpp_dec_float_NaN)) &&
                 (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    (&local_bc8,&local_778), iVar8 < 1)) {
                DIdxSet::addIdx(&local_c18,(int)lVar11);
              }
            }
            lVar11 = lVar11 + 1;
            lVar10 = lVar10 + 0x80;
          } while (lVar11 < (this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum);
        }
        do {
          lVar10 = (long)local_c18.super_IdxSet.num;
          if ((lVar10 < 1) || (bVar5)) {
            iVar8 = 0;
          }
          else {
            iVar8 = 0;
            do {
              local_c20 = (DataKey)id(this,local_c18.super_IdxSet.idx[lVar10 + -1]);
              bVar6 = enter(this,(SPxId *)&local_c20,true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar6) {
                iVar8 = iVar8 + 1;
                lVar11 = (long)local_c18.super_IdxSet.num;
                local_c18.super_IdxSet.num = local_c18.super_IdxSet.num + -1;
                local_c18.super_IdxSet.idx[lVar10 + -1] = local_c18.super_IdxSet.idx[lVar11 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar5 = true;
                }
              }
              bVar6 = isTimeLimitReached(this,false);
              if (bVar6) {
                bVar5 = true;
              }
            } while ((1 < lVar10) && (lVar10 = lVar10 + -1, !bVar5));
          }
          if (iVar8 == 0) {
            bVar5 = true;
          }
          this->polishCount = this->polishCount + iVar8;
        } while (!bVar5);
      }
    }
    else {
      local_b48 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                   *)&(this->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.colstat.data;
      setType(this,LEAVE);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])(this);
      leavetol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_bc8,this);
      pcVar19 = &local_bc8;
      puVar21 = local_5f8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar21 = (((cpp_dec_float<200U,_int,_void> *)&pcVar19->data)->data)._M_elems[0];
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + ((ulong)bVar25 * -2 + 1) * 4);
        puVar21 = puVar21 + (ulong)bVar25 * -2 + 1;
      }
      local_bdc = local_bc8.exp;
      local_c21 = local_bc8.neg;
      local_a88 = local_bc8.fpclass;
      iStack_a84 = local_bc8.prec_elem;
      uStack_a80 = 0;
      this->instableLeave = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      local_be8 = (Status *)
                  CONCAT44(local_be8._4_4_,
                           (this->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set.thenum);
      iVar8 = (this->integerVariables).thesize;
      local_bf0 = (Status *)CONCAT44(local_bf0._4_4_,iVar8);
      if (this->polishObj == POLISH_INTEGRALITY) {
        DIdxSet::DIdxSet(&local_c18,(this->thecovectors->set).thenum);
        if (0 < (this->thecovectors->set).thenum) {
          local_bf8 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       *)&(this->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thedesc.rowstat.data;
          local_b10 = &(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set;
          lVar10 = 0xf;
          lVar11 = 0;
          do {
            local_c20 = (this->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).theBaseId.data[lVar11].super_DataKey;
            if (local_c20.info < 0) {
              iVar9 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::number(&this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ,(SPxId *)&local_c20);
              pCVar13 = local_bf8;
LAB_005192e6:
              if ((*(uint *)((long)&(pCVar13->theitem->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem + (long)iVar9 * 4) & 0xfffffffd) == 0xfffffffc) {
                plVar15 = (long *)((((this->theFvec->
                                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                   _M_elems + lVar10 * 2);
                plVar17 = plVar15 + -0xf;
                puVar18 = local_210;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  *puVar18 = (int)*plVar17;
                  plVar17 = (long *)((long)plVar17 + (ulong)bVar25 * -8 + 4);
                  puVar18 = puVar18 + (ulong)bVar25 * -2 + 1;
                }
                lVar12 = plVar15[-1];
                bVar1 = *(byte *)((long)plVar15 + -4);
                local_bd8 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                             *)*plVar15;
                uStack_bd0 = 0;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>(&local_500,0,(type *)0x0);
                RVar26 = Tolerances::epsilon((this->
                                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             )._tolerances.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
                local_7f8.fpclass = cpp_dec_float_finite;
                local_7f8.prec_elem = 0x1c;
                local_7f8.data._M_elems[0] = 0;
                local_7f8.data._M_elems[1] = 0;
                local_7f8.data._M_elems[2] = 0;
                local_7f8.data._M_elems[3] = 0;
                local_7f8.data._M_elems[4] = 0;
                local_7f8.data._M_elems[5] = 0;
                local_7f8.data._M_elems[6] = 0;
                local_7f8.data._M_elems[7] = 0;
                local_7f8.data._M_elems[8] = 0;
                local_7f8.data._M_elems[9] = 0;
                local_7f8.data._M_elems[10] = 0;
                local_7f8.data._M_elems[0xb] = 0;
                local_7f8.data._M_elems[0xc] = 0;
                local_7f8.data._M_elems[0xd] = 0;
                local_7f8.data._M_elems[0xe] = 0;
                local_7f8.data._M_elems[0xf] = 0;
                local_7f8.data._M_elems[0x10] = 0;
                local_7f8.data._M_elems[0x11] = 0;
                local_7f8.data._M_elems[0x12] = 0;
                local_7f8.data._M_elems[0x13] = 0;
                local_7f8.data._M_elems[0x14] = 0;
                local_7f8.data._M_elems[0x15] = 0;
                local_7f8.data._M_elems[0x16] = 0;
                local_7f8.data._M_elems[0x17] = 0;
                local_7f8.data._M_elems[0x18] = 0;
                local_7f8.data._M_elems[0x19] = 0;
                local_7f8.data._M_elems._104_5_ = 0;
                local_7f8.data._M_elems[0x1b]._1_3_ = 0;
                local_7f8.exp = 0;
                local_7f8.neg = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)&local_7f8,RVar26);
                puVar18 = local_210;
                psVar23 = local_9f8;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  *(undefined4 *)psVar23 = *puVar18;
                  puVar18 = puVar18 + (ulong)bVar25 * -2 + 1;
                  psVar23 = psVar23 + (ulong)bVar25 * -8 + 4;
                }
                local_988 = (int)lVar12;
                local_984 = bVar1;
                local_980 = local_bd8;
                pcVar19 = &local_500;
                pnVar20 = &local_a78;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar19 + ((ulong)bVar25 * -2 + 1) * 4);
                  pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar20 + ((ulong)bVar25 * -2 + 1) * 4);
                }
                local_a78.m_backend.exp = local_500.exp;
                local_a78.m_backend.neg = local_500.neg;
                local_a78.m_backend.fpclass = local_500.fpclass;
                local_a78.m_backend.prec_elem = local_500.prec_elem;
                relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                          (&local_b08,local_9f8,&local_a78,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x0);
                local_bc8.fpclass = cpp_dec_float_finite;
                local_bc8.prec_elem = 0x1c;
                local_bc8.neg = false;
                local_bc8.exp = 0;
                pnVar20 = &local_b08;
                pcVar19 = &local_bc8;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  (pcVar19->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
                  pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar20 + ((ulong)bVar25 * -2 + 1) * 4);
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar19 + (ulong)bVar25 * -8 + 4);
                }
                local_bc8.exp = local_b08.m_backend.exp;
                local_bc8.neg = local_b08.m_backend.neg;
                local_bc8.fpclass = local_b08.m_backend.fpclass;
                local_bc8.prec_elem = local_b08.m_backend.prec_elem;
                if ((local_b08.m_backend.neg == true) &&
                   (local_bc8.data._M_elems[0] != ERROR ||
                    local_b08.m_backend.fpclass != cpp_dec_float_finite)) {
                  local_bc8.neg = false;
                }
                if ((local_b08.m_backend.fpclass == cpp_dec_float_NaN) ||
                   (local_7f8.fpclass == cpp_dec_float_NaN)) {
                  iVar8 = (int)local_bf0;
                }
                else {
                  iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    (&local_bc8,&local_7f8);
                  iVar8 = (int)local_bf0;
                  if (iVar9 < 1) {
                    DIdxSet::addIdx(&local_c18,(int)lVar11);
                  }
                }
              }
            }
            else if (iVar8 == (int)local_be8) {
              SPxColId::SPxColId((SPxColId *)&local_bc8,(SPxId *)&local_c20);
              iVar9 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                      ::number(local_b10,(DataKey *)&local_bc8);
              if ((this->integerVariables).data[iVar9] != 1) {
                iVar9 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::number(&this->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ,(SPxId *)&local_c20);
                pCVar13 = local_b48;
                goto LAB_005192e6;
              }
            }
            lVar11 = lVar11 + 1;
            lVar10 = lVar10 + 0x10;
          } while (lVar11 < (this->thecovectors->set).thenum);
        }
        do {
          lVar10 = (long)local_c18.super_IdxSet.num;
          if ((lVar10 < 1) || (bVar5)) {
            iVar8 = 0;
          }
          else {
            iVar8 = 0;
            do {
              bVar6 = leave(this,local_c18.super_IdxSet.idx[lVar10 + -1],true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar6) {
                iVar8 = iVar8 + 1;
                lVar11 = (long)local_c18.super_IdxSet.num;
                local_c18.super_IdxSet.num = local_c18.super_IdxSet.num + -1;
                local_c18.super_IdxSet.idx[lVar10 + -1] = local_c18.super_IdxSet.idx[lVar11 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar5 = true;
                }
              }
              bVar6 = isTimeLimitReached(this,false);
              if (bVar6) {
                bVar5 = true;
              }
            } while ((1 < lVar10) && (lVar10 = lVar10 + -1, !bVar5));
          }
          if (iVar8 == 0) {
            bVar5 = true;
          }
          this->polishCount = this->polishCount + iVar8;
        } while (!bVar5);
      }
      else {
        DIdxSet::DIdxSet(&local_c18,(this->thecovectors->set).thenum);
        if (0 < (this->thecovectors->set).thenum) {
          local_bf8 = &(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set;
          lVar10 = 0x3c;
          lVar11 = 0;
          do {
            local_c20 = (this->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).theBaseId.data[lVar11].super_DataKey;
            if (-1 < local_c20.info) {
              if (iVar8 == (int)local_be8) {
                SPxColId::SPxColId((SPxColId *)&local_bc8,(SPxId *)&local_c20);
                iVar9 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                        ::number(local_bf8,(DataKey *)&local_bc8);
                if ((this->integerVariables).data[iVar9] == 0) goto LAB_00519ca5;
              }
              if ((*(uint *)((long)&(local_b48->theitem->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem + lVar11 * 4) & 0xfffffffd) == 0xfffffffc) {
                plVar15 = (long *)((long)(((this->theFvec->
                                           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                         data._M_elems + lVar10 * 2);
                plVar17 = plVar15 + -0xf;
                puVar18 = local_280;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  *puVar18 = (int)*plVar17;
                  plVar17 = (long *)((long)plVar17 + (ulong)bVar25 * -8 + 4);
                  puVar18 = puVar18 + (ulong)bVar25 * -2 + 1;
                }
                lVar12 = plVar15[-1];
                bVar1 = *(byte *)((long)plVar15 + -4);
                local_bd8 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                             *)*plVar15;
                uStack_bd0 = 0;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>(&local_580,0,(type *)0x0);
                RVar26 = Tolerances::epsilon((this->
                                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             )._tolerances.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 0x1c;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems[6] = 0;
                local_878.data._M_elems[7] = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.data._M_elems[10] = 0;
                local_878.data._M_elems[0xb] = 0;
                local_878.data._M_elems[0xc] = 0;
                local_878.data._M_elems[0xd] = 0;
                local_878.data._M_elems[0xe] = 0;
                local_878.data._M_elems[0xf] = 0;
                local_878.data._M_elems[0x10] = 0;
                local_878.data._M_elems[0x11] = 0;
                local_878.data._M_elems[0x12] = 0;
                local_878.data._M_elems[0x13] = 0;
                local_878.data._M_elems[0x14] = 0;
                local_878.data._M_elems[0x15] = 0;
                local_878.data._M_elems[0x16] = 0;
                local_878.data._M_elems[0x17] = 0;
                local_878.data._M_elems[0x18] = 0;
                local_878.data._M_elems[0x19] = 0;
                local_878.data._M_elems._104_5_ = 0;
                local_878.data._M_elems[0x1b]._1_3_ = 0;
                local_878.exp = 0;
                local_878.neg = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)&local_878,RVar26);
                puVar18 = local_280;
                psVar23 = local_9f8;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  *(undefined4 *)psVar23 = *puVar18;
                  puVar18 = puVar18 + (ulong)bVar25 * -2 + 1;
                  psVar23 = psVar23 + (ulong)bVar25 * -8 + 4;
                }
                local_988 = (int)lVar12;
                local_984 = bVar1;
                local_980 = local_bd8;
                pcVar19 = &local_580;
                pnVar20 = &local_a78;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar19 + ((ulong)bVar25 * -2 + 1) * 4);
                  pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar20 + ((ulong)bVar25 * -2 + 1) * 4);
                }
                local_a78.m_backend.exp = local_580.exp;
                local_a78.m_backend.neg = local_580.neg;
                local_a78.m_backend.fpclass = local_580.fpclass;
                local_a78.m_backend.prec_elem = local_580.prec_elem;
                relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                          (&local_b08,local_9f8,&local_a78,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x0);
                local_bc8.fpclass = cpp_dec_float_finite;
                local_bc8.prec_elem = 0x1c;
                local_bc8.neg = false;
                local_bc8.exp = 0;
                pnVar20 = &local_b08;
                pcVar19 = &local_bc8;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  (pcVar19->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
                  pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar20 + ((ulong)bVar25 * -2 + 1) * 4);
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar19 + (ulong)bVar25 * -8 + 4);
                }
                local_bc8.exp = local_b08.m_backend.exp;
                local_bc8.neg = local_b08.m_backend.neg;
                local_bc8.fpclass = local_b08.m_backend.fpclass;
                local_bc8.prec_elem = local_b08.m_backend.prec_elem;
                if ((local_b08.m_backend.neg == true) &&
                   (local_bc8.data._M_elems[0] != ERROR ||
                    local_b08.m_backend.fpclass != cpp_dec_float_finite)) {
                  local_bc8.neg = false;
                }
                if ((local_b08.m_backend.fpclass == cpp_dec_float_NaN) ||
                   (local_878.fpclass == cpp_dec_float_NaN)) {
                  iVar8 = (int)local_bf0;
                }
                else {
                  iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    (&local_bc8,&local_878);
                  iVar8 = (int)local_bf0;
                  if (iVar9 < 1) {
                    DIdxSet::addIdx(&local_c18,(int)lVar11);
                  }
                }
              }
            }
LAB_00519ca5:
            lVar11 = lVar11 + 1;
            lVar10 = lVar10 + 0x40;
          } while (lVar11 < (this->thecovectors->set).thenum);
        }
        do {
          lVar10 = (long)local_c18.super_IdxSet.num;
          if ((lVar10 < 1) || (bVar5)) {
            iVar8 = 0;
          }
          else {
            iVar8 = 0;
            do {
              bVar6 = leave(this,local_c18.super_IdxSet.idx[lVar10 + -1],true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar6) {
                iVar8 = iVar8 + 1;
                lVar11 = (long)local_c18.super_IdxSet.num;
                local_c18.super_IdxSet.num = local_c18.super_IdxSet.num + -1;
                local_c18.super_IdxSet.idx[lVar10 + -1] = local_c18.super_IdxSet.idx[lVar11 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar5 = true;
                }
              }
              bVar6 = isTimeLimitReached(this,false);
              if (bVar6) {
                bVar5 = true;
              }
            } while ((1 < lVar10) && (lVar10 = lVar10 + -1, !bVar5));
          }
          if (iVar8 == 0) {
            bVar5 = true;
          }
          this->polishCount = this->polishCount + iVar8;
        } while (!bVar5);
      }
    }
    DIdxSet::~DIdxSet(&local_c18);
    pSVar2 = this->spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (2 < (int)pSVar2->m_verbosity)) {
      local_b08.m_backend.data._M_elems[0] = 3;
      local_bc8.data._M_elems[0] = pSVar2->m_verbosity;
      (*pSVar2->_vptr_SPxOut[2])();
      pSVar2 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar2->m_streams[pSVar2->m_verbosity]," --- finished solution polishing (",0x22);
      std::ostream::operator<<((ostream *)pSVar2->m_streams[pSVar2->m_verbosity],this->polishCount);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar2->m_streams[pSVar2->m_verbosity]," pivots)",8);
      cVar4 = (char)pSVar2->m_streams[pSVar2->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar2->m_streams[pSVar2->m_verbosity] + -0x18)
                      + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_bc8);
    }
    if ((this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus != OPTIMAL) {
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus = OPTIMAL;
    }
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(local_b0,this);
    puVar21 = local_130;
    pnVar20 = &local_a78;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar20->m_backend).data._M_elems[0] = *puVar21;
      puVar21 = puVar21 + (ulong)bVar25 * -2 + 1;
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar25 * -2 + 1) * 4);
    }
    puVar21 = local_5f8;
    pcVar19 = &local_300;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pcVar19->data)._M_elems[0] = *puVar21;
      puVar21 = puVar21 + (ulong)bVar25 * -2 + 1;
      pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + ((ulong)bVar25 * -2 + 1) * 4);
    }
    local_300.exp = local_bdc;
    local_300.neg = (bool)local_c21;
    local_300.fpclass = local_a88;
    local_300.prec_elem = iStack_a84;
    puVar18 = local_b0;
    psVar23 = local_9f8;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      *(undefined4 *)psVar23 = *puVar18;
      puVar18 = puVar18 + (ulong)bVar25 * -2 + 1;
      psVar23 = psVar23 + (ulong)bVar25 * -8 + 4;
    }
    local_988 = local_40;
    local_984 = local_3c;
    local_980 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                 *)local_38;
    local_a78.m_backend.exp = local_c0;
    local_a78.m_backend.neg = (bool)local_bc;
    local_a78.m_backend.fpclass = local_b8;
    local_a78.m_backend.prec_elem = iStack_b4;
    relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_b08,local_9f8,&local_a78,local_38);
    local_bc8.fpclass = cpp_dec_float_finite;
    local_bc8.prec_elem = 0x1c;
    local_bc8.exp = 0;
    local_bc8.neg = false;
    pnVar20 = &local_b08;
    pcVar19 = &local_bc8;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pcVar19->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar25 * -2 + 1) * 4);
      pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + ((ulong)bVar25 * -2 + 1) * 4);
    }
    local_bc8.exp = local_b08.m_backend.exp;
    local_bc8.neg = local_b08.m_backend.neg;
    local_bc8.fpclass = local_b08.m_backend.fpclass;
    local_bc8.prec_elem = local_b08.m_backend.prec_elem;
    if ((local_b08.m_backend.neg == true) &&
       (local_bc8.data._M_elems[0] != ERROR || local_b08.m_backend.fpclass != cpp_dec_float_finite))
    {
      local_bc8.neg = false;
    }
    bVar5 = true;
    if ((local_b08.m_backend.fpclass != cpp_dec_float_NaN) &&
       (local_300.fpclass != cpp_dec_float_NaN)) {
      iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&local_bc8,&local_300);
      bVar5 = 0 < iVar8;
    }
  }
  return bVar5;
}

Assistant:

bool SPxSolverBase<R>::performSolutionPolishing()
{
   // catch rare case that the iteration limit is exactly reached at optimality
   bool stop = (maxIters >= 0 && iterations() >= maxIters && !isTimeLimitReached());

   // only polish an already optimal basis
   if(stop || polishObj == POLISH_OFF || status() != OPTIMAL)
      return false;

   int nSuccessfulPivots;
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   const typename SPxBasisBase<R>::Desc::Status* rowstatus = ds.rowStatus();
   const typename SPxBasisBase<R>::Desc::Status* colstatus = ds.colStatus();
   typename SPxBasisBase<R>::Desc::Status stat;
   SPxId polishId;
   bool success = false;

   R alloweddeviation;
   R origval = value();

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- perform solution polishing" << std::endl;)

   if(rep() == COLUMN)
   {
      setType(ENTER); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = entertol();

      instableEnter = false;
      theratiotester->setType(type());

      int nrows = this->nRows();
      int ncols = this->nCols();

      assert(nrows >= 0);
      assert(ncols >= 0);

      if(polishObj == POLISH_INTEGRALITY)
      {
         DIdxSet slackcandidates(nrows);
         DIdxSet continuousvars(ncols);

         // collect nonbasic slack variables that could be made basic
         for(int i = 0; i < nrows; ++i)
         {
            // only check nonbasic rows, skip equations
            if(rowstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_LOWER
                  || rowstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider rows with zero dual multiplier to preserve optimality
               if(EQrel((*theCoPvec)[i], (R) 0, this->epsilon()))
                  slackcandidates.addIdx(i);
            }
         }

         // collect continuous variables that could be made basic
         if(integerVariables.size() == ncols)
         {
            for(int i = 0; i < ncols; ++i)
            {
               // skip fixed variables
               if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                     || colstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
               {
                  // only consider continuous variables with zero dual multiplier to preserve optimality
                  if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()) && integerVariables[i] == 0)
                     continuousvars.addIdx(i);
               }
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            // identify nonbasic slack variables, i.e. rows, that may be moved into the basis
            for(int i = slackcandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = coId(slackcandidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, rowstatus[slackcandidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  slackcandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // identify nonbasic variables that may be moved into the basis
            for(int i = continuousvars.size() - 1; i >= 0 && !stop; --i)
            {
               polishId = id(continuousvars.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[continuousvars.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  continuousvars.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet candidates(dim());

         // identify nonbasic variables, i.e. columns, that may be moved into the basis
         for(int i = 0; i < this->nCols() && !stop; ++i)
         {
            if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || colstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider variables with zero reduced costs to preserve optimality
               if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()))
                  candidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = candidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = id(candidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[candidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  candidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }
   else
   {
      setType(LEAVE); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = leavetol();
      instableLeave = false;
      theratiotester->setType(type());
      bool useIntegrality = false;
      int ncols = this->nCols();

      if(integerVariables.size() == ncols)
         useIntegrality = true;

      // in ROW rep: pivot slack out of the basis
      if(polishObj == POLISH_INTEGRALITY)
      {
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic candidates that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               stat = ds.rowStatus(this->number(polishId));
            else
            {
               // skip (integer) variables
               if(!useIntegrality || integerVariables[this->number(SPxColId(polishId))] == 1)
                  continue;

               stat = ds.colStatus(this->number(polishId));
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic (integer) variables, that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               continue;
            else
            {
               if(useIntegrality && integerVariables[this->number(SPxColId(polishId))] == 0)
                  continue;

               stat = ds.colStatus(i);
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }

   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- finished solution polishing (" << polishCount << " pivots)" << std::endl;)

   this->setStatus(SPxBasisBase<R>::OPTIMAL);

   // if the value() changed significantly (due to numerics) reoptimize after polishing
   if(!EQrel(value(), origval, alloweddeviation))
      return true;
   else
      return false;
}